

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# learn.cc
# Opt level: O3

int main(int argc,char **argv)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  pointer pbVar5;
  pointer pcVar6;
  Options OVar7;
  element_type *peVar8;
  long *plVar9;
  int iVar10;
  OptionAdder *pOVar11;
  size_t sVar12;
  ostream *poVar13;
  OptionValue *pOVar14;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar15;
  SentencePieceLearner *this;
  bool *pbVar16;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar17;
  long lVar18;
  char **argv_00;
  void *pvVar19;
  int *piVar20;
  ulong uVar21;
  char *pcVar22;
  uint uVar23;
  pointer pbVar24;
  bool bVar25;
  string outputFileName;
  ParseResult subvm;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  subword_args;
  ParseResult vm;
  Tokenizer tokenizer;
  ofstream outputFile;
  Options cmd_options;
  undefined8 in_stack_fffffffffffff428;
  undefined4 uVar26;
  undefined4 in_stack_fffffffffffff434;
  undefined4 uVar27;
  undefined4 in_stack_fffffffffffff438;
  undefined4 in_stack_fffffffffffff43c;
  _Alloc_hider _Var28;
  undefined4 in_stack_fffffffffffff440;
  undefined4 in_stack_fffffffffffff444;
  undefined8 in_stack_fffffffffffff448;
  undefined8 in_stack_fffffffffffff450;
  _Alloc_hider in_stack_fffffffffffff458;
  _Alloc_hider _Var29;
  _Alloc_hider _Var30;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_stack_fffffffffffff460;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var31;
  undefined8 in_stack_fffffffffffff468;
  undefined8 in_stack_fffffffffffff470;
  undefined4 uVar32;
  _Alloc_hider _Var33;
  undefined4 uVar34;
  undefined8 in_stack_fffffffffffff488;
  undefined8 in_stack_fffffffffffff490;
  _Alloc_hider _Var35;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var36;
  undefined8 in_stack_fffffffffffff4a8;
  undefined1 in_stack_fffffffffffff4b0 [24];
  undefined1 auVar37 [16];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var38;
  string local_b30;
  undefined1 local_b10 [16];
  undefined1 local_b00 [24];
  bool local_ae8;
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_cxxopts::OptionValue>,_std::allocator<std::pair<const_unsigned_long,_cxxopts::OptionValue>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_ae0;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_aa8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_a70;
  element_type *local_a68;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_a60;
  undefined1 local_a58 [16];
  undefined1 local_a48 [32];
  undefined1 local_a28 [32];
  shared_ptr<const_cxxopts::Value> local_a08;
  undefined1 local_9f8 [16];
  __weak_count<(__gnu_cxx::_Lock_policy)2> local_9e8;
  pointer local_9e0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> local_9d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_9c8;
  pointer local_9c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_9b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_9a8;
  pointer local_9a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_998;
  undefined1 local_988 [32];
  undefined1 local_968 [40];
  undefined1 local_940 [20];
  undefined4 uStack_92c;
  undefined4 uStack_928;
  undefined4 uStack_924;
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_cxxopts::OptionValue>,_std::allocator<std::pair<const_unsigned_long,_cxxopts::OptionValue>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_908;
  vector<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_> local_8d0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_8b8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_8a0;
  element_type *local_888;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_880;
  element_type *local_878;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_870;
  element_type *local_868;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_860;
  element_type *local_858;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_850;
  string local_848;
  string local_828;
  string local_808;
  string local_7e8;
  string local_7c8;
  string local_7a8;
  shared_ptr<const_cxxopts::Value> local_788;
  shared_ptr<const_cxxopts::Value> local_778;
  shared_ptr<const_cxxopts::Value> local_768;
  shared_ptr<const_cxxopts::Value> local_758;
  shared_ptr<const_cxxopts::Value> local_748;
  long *local_738;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_730;
  long local_728 [2];
  undefined1 local_718 [56];
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_cxxopts::OptionValue>,_std::allocator<std::pair<const_unsigned_long,_cxxopts::OptionValue>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_6e0;
  vector<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_> local_6a8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_690;
  string local_678;
  string local_658;
  string local_638;
  string local_618;
  string local_5f8;
  string local_5d8;
  string local_5b8;
  string local_598;
  string local_578;
  string local_558;
  string local_538;
  string local_518;
  long local_4f8 [3];
  long *local_4e0;
  long local_4d0 [3];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_4b8;
  _Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_4a0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_460;
  undefined1 local_458 [8];
  _Alloc_hider _Stack_450;
  undefined1 local_448 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_438;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_428;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_418;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_408;
  undefined1 auStack_3f8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_3e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_3d8;
  size_t local_3c8;
  element_type *apeStack_3c0 [2];
  char local_3b0 [80];
  ios_base local_360 [272];
  Options local_250;
  undefined1 local_1a8 [376];
  
  local_538._M_dataplus._M_p = (pointer)&local_538.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_538,"subword_learn","");
  local_558._M_dataplus._M_p = (pointer)&local_558.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_558,
             "Subword learning script.\n\nsubword_learn [TOKENIZATION_OPTIONS...] -- [SUBWORD_TYPE] [SUBWORD_OPTIONS...] < input_file > output_file\n"
             ,"");
  cxxopts::Options::Options((Options *)local_1a8,&local_538,&local_558);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_558._M_dataplus._M_p != &local_558.field_2) {
    operator_delete(local_558._M_dataplus._M_p,local_558.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_538._M_dataplus._M_p != &local_538.field_2) {
    operator_delete(local_538._M_dataplus._M_p,local_538.field_2._M_allocated_capacity + 1);
  }
  local_9a8 = &local_998;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_9a8,"");
  uVar26 = local_998._M_allocated_capacity._0_4_;
  local_448._0_8_ = local_9a0;
  if (local_9a8 == &local_998) {
    local_518.field_2._8_4_ = local_998._8_4_;
    local_518.field_2._12_4_ = local_998._12_4_;
    local_9a8 = &local_518.field_2;
  }
  local_518.field_2._M_allocated_capacity._4_4_ = local_998._M_allocated_capacity._4_4_;
  local_518.field_2._M_allocated_capacity._0_4_ = local_998._M_allocated_capacity._0_4_;
  local_9a0 = (pointer)0x0;
  local_998._M_allocated_capacity._0_4_ = local_998._M_allocated_capacity._0_4_ & 0xffffff00;
  _Stack_450._M_p = local_448 + 8;
  if (local_9a8 == &local_518.field_2) {
    local_448._8_8_ = CONCAT44(local_998._M_allocated_capacity._4_4_,uVar26);
    aStack_438._4_4_ = local_518.field_2._12_4_;
    aStack_438._0_4_ = local_518.field_2._8_4_;
  }
  else {
    local_448._8_8_ = local_518.field_2._M_allocated_capacity;
    _Stack_450._M_p = (pointer)local_9a8;
  }
  paVar1 = &local_518.field_2;
  local_9a8 = &local_998;
  local_518._M_dataplus._M_p = (pointer)paVar1;
  local_458 = (undefined1  [8])local_1a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_518,"h,help","");
  local_b10._0_8_ = local_b00;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b10,"Show this help","");
  std::__shared_ptr<cxxopts::values::standard_value<bool>,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<std::allocator<cxxopts::values::standard_value<bool>>>
            ((__shared_ptr<cxxopts::values::standard_value<bool>,(__gnu_cxx::_Lock_policy)2> *)
             local_718,(allocator<cxxopts::values::standard_value<bool>_> *)local_940);
  uVar26 = local_718._8_4_;
  uVar27 = local_718._12_4_;
  local_578._M_dataplus._M_p = (pointer)&local_578.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_578,"");
  pOVar11 = cxxopts::OptionAdder::operator()
                      ((OptionAdder *)local_458,&local_518,(string *)local_b10,
                       (shared_ptr<const_cxxopts::Value> *)&stack0xfffffffffffff478,&local_578);
  local_718._0_8_ = local_718 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_718,"v,verbose","");
  local_940._0_8_ = local_940 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_940,"Enable verbose output","");
  std::__shared_ptr<cxxopts::values::standard_value<bool>,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<std::allocator<cxxopts::values::standard_value<bool>>>
            ((__shared_ptr<cxxopts::values::standard_value<bool>,(__gnu_cxx::_Lock_policy)2> *)
             &stack0xfffffffffffff438,
             (allocator<cxxopts::values::standard_value<bool>_> *)&local_b30);
  _Var28._M_p = &stack0xfffffffffffff448;
  p_Var38 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
            CONCAT44(in_stack_fffffffffffff444,in_stack_fffffffffffff440);
  std::__cxx11::string::_M_construct<char_const*>((string *)&stack0xfffffffffffff438,"false","");
  (**(code **)(*(long *)CONCAT44(in_stack_fffffffffffff43c,in_stack_fffffffffffff438) + 0x50))
            (&stack0xfffffffffffff458,
             (long *)CONCAT44(in_stack_fffffffffffff43c,in_stack_fffffffffffff438),
             &stack0xfffffffffffff438);
  p_Var31 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_598._M_dataplus._M_p = (pointer)&local_598.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_598,"");
  cxxopts::OptionAdder::operator()
            (pOVar11,(string *)local_718,(string *)local_940,
             (shared_ptr<const_cxxopts::Value> *)&stack0xfffffffffffff498,&local_598);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_598._M_dataplus._M_p != &local_598.field_2) {
    operator_delete(local_598._M_dataplus._M_p,local_598.field_2._M_allocated_capacity + 1);
  }
  if (in_stack_fffffffffffff460._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(in_stack_fffffffffffff460._M_pi);
  }
  if (p_Var31 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var31);
  }
  if ((element_type *)_Var28._M_p != (element_type *)&stack0xfffffffffffff448) {
    operator_delete(_Var28._M_p,in_stack_fffffffffffff448 + 1);
  }
  if (p_Var38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var38);
  }
  if ((undefined1 *)local_940._0_8_ != local_940 + 0x10) {
    operator_delete((void *)local_940._0_8_,stack0xfffffffffffff6d0 + 1);
  }
  if ((undefined1 *)local_718._0_8_ != local_718 + 0x10) {
    operator_delete((void *)local_718._0_8_,local_718._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_578._M_dataplus._M_p != &local_578.field_2) {
    operator_delete(local_578._M_dataplus._M_p,local_578.field_2._M_allocated_capacity + 1);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT44(uVar27,uVar26) !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT44(uVar27,uVar26));
  }
  if ((vector<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_> *)local_b10._0_8_ !=
      (vector<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_> *)local_b00) {
    operator_delete((void *)local_b10._0_8_,(ulong)(local_b00._0_8_ + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_518._M_dataplus._M_p != paVar1) {
    operator_delete(local_518._M_dataplus._M_p,local_518.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Stack_450._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)(local_448 + 8)) {
    operator_delete(_Stack_450._M_p,local_448._8_8_ + 1);
  }
  if (local_9a8 != &local_998) {
    operator_delete(local_9a8,
                    CONCAT44(local_998._M_allocated_capacity._4_4_,
                             local_998._M_allocated_capacity._0_4_) + 1);
  }
  add_tokenization_options((Options *)local_1a8);
  local_9c8 = &local_9b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_9c8,"Subword learning","");
  uVar32 = local_9b8._M_allocated_capacity._0_4_;
  local_448._0_8_ = local_9c0;
  if (local_9c8 == &local_9b8) {
    local_518.field_2._8_4_ = local_9b8._8_4_;
    local_518.field_2._12_4_ = local_9b8._12_4_;
    local_9c8 = paVar1;
  }
  local_518.field_2._M_allocated_capacity._4_4_ = local_9b8._M_allocated_capacity._4_4_;
  local_518.field_2._M_allocated_capacity._0_4_ = local_9b8._M_allocated_capacity._0_4_;
  local_9c0 = (pointer)0x0;
  local_9b8._M_allocated_capacity._0_4_ = local_9b8._M_allocated_capacity._0_4_ & 0xffffff00;
  if (local_9c8 == paVar1) {
    local_448._8_8_ = CONCAT44(local_9b8._M_allocated_capacity._4_4_,uVar32);
    aStack_438._4_4_ = local_518.field_2._12_4_;
    aStack_438._0_4_ = local_518.field_2._8_4_;
    _Stack_450._M_p = (pointer)(local_448 + 8);
  }
  else {
    local_448._8_8_ = local_518.field_2._M_allocated_capacity;
    _Stack_450._M_p = (pointer)local_9c8;
  }
  local_9c8 = &local_9b8;
  local_518._M_dataplus._M_p = (pointer)&local_518.field_2;
  local_458 = (undefined1  [8])local_1a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_518,"i,input","");
  local_b10._0_8_ = (vector<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_> *)local_b00;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_b10,"Input files (if not set, the standard input is used)","");
  std::
  __shared_ptr<cxxopts::values::standard_value<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,(__gnu_cxx::_Lock_policy)2>
  ::
  __shared_ptr<std::allocator<cxxopts::values::standard_value<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
            ((__shared_ptr<cxxopts::values::standard_value<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,(__gnu_cxx::_Lock_policy)2>
              *)local_718,
             (allocator<cxxopts::values::standard_value<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              *)local_940);
  local_a08.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_718._0_8_;
  local_a08.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
  _0_4_ = local_718._8_4_;
  local_a08.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
  _4_4_ = local_718._12_4_;
  local_5b8._M_dataplus._M_p = (pointer)&local_5b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5b8,"");
  pOVar11 = cxxopts::OptionAdder::operator()
                      ((OptionAdder *)local_458,&local_518,(string *)local_b10,&local_a08,&local_5b8
                      );
  local_718._0_8_ = local_718 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_718,"o,output","");
  local_940._0_8_ = local_940 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_940,"Output file (if not set, the standard output is used)","");
  local_a28._0_8_ = _Var28._M_p;
  std::
  __shared_ptr<cxxopts::values::standard_value<std::__cxx11::string>,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<std::allocator<cxxopts::values::standard_value<std::__cxx11::string>>>
            ((__shared_ptr<cxxopts::values::standard_value<std::__cxx11::string>,(__gnu_cxx::_Lock_policy)2>
              *)&stack0xfffffffffffff438,
             (allocator<cxxopts::values::standard_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&stack0xfffffffffffff478);
  local_7a8._M_dataplus._M_p = (pointer)&local_7a8.field_2;
  local_a28._8_4_ = in_stack_fffffffffffff440;
  local_a28._12_4_ = in_stack_fffffffffffff444;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_7a8,"");
  pOVar11 = cxxopts::OptionAdder::operator()
                      (pOVar11,(string *)local_718,(string *)local_940,
                       (shared_ptr<const_cxxopts::Value> *)local_a28,&local_7a8);
  _Var28._M_p = &stack0xfffffffffffff448;
  std::__cxx11::string::_M_construct<char_const*>((string *)&stack0xfffffffffffff438,"tmpfile","");
  _Var33._M_p = &stack0xfffffffffffff488;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&stack0xfffffffffffff478,"Temporary file for file-based learner","");
  std::
  __shared_ptr<cxxopts::values::standard_value<std::__cxx11::string>,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<std::allocator<cxxopts::values::standard_value<std::__cxx11::string>>>
            ((__shared_ptr<cxxopts::values::standard_value<std::__cxx11::string>,(__gnu_cxx::_Lock_policy)2>
              *)&stack0xfffffffffffff498,
             (allocator<cxxopts::values::standard_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&stack0xfffffffffffff458);
  _Var30._M_p = &stack0xfffffffffffff4a8;
  _Var36._M_pi = in_stack_fffffffffffff460._M_pi;
  std::__cxx11::string::_M_construct<char_const*>((string *)&stack0xfffffffffffff498,"input.tmp","")
  ;
  (**(code **)(*(long *)in_stack_fffffffffffff458._M_p + 0x50))
            (&local_a68,in_stack_fffffffffffff458._M_p,&stack0xfffffffffffff498);
  local_988._0_8_ = local_a68;
  local_988._8_8_ = p_Stack_a60;
  local_a68 = (element_type *)0x0;
  p_Stack_a60 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_5d8._M_dataplus._M_p = (pointer)&local_5d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5d8,"");
  pOVar11 = cxxopts::OptionAdder::operator()
                      (pOVar11,(string *)&stack0xfffffffffffff438,(string *)&stack0xfffffffffffff478
                       ,(shared_ptr<const_cxxopts::Value> *)local_988,&local_5d8);
  _Var29._M_p = &stack0xfffffffffffff468;
  std::__cxx11::string::_M_construct<char_const*>((string *)&stack0xfffffffffffff458,"subword","");
  local_b30._M_dataplus._M_p = (pointer)&local_b30.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_b30,"Arguments for subword learner","");
  std::
  __shared_ptr<cxxopts::values::standard_value<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,(__gnu_cxx::_Lock_policy)2>
  ::
  __shared_ptr<std::allocator<cxxopts::values::standard_value<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
            ((__shared_ptr<cxxopts::values::standard_value<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,(__gnu_cxx::_Lock_policy)2>
              *)local_968,
             (allocator<cxxopts::values::standard_value<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              *)&local_848);
  local_a48._0_8_ = local_968._0_8_;
  local_a48._8_4_ = local_968._8_4_;
  local_a48._12_4_ = local_968._12_4_;
  local_5f8._M_dataplus._M_p = (pointer)&local_5f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5f8,"");
  cxxopts::OptionAdder::operator()
            (pOVar11,(string *)&stack0xfffffffffffff458,&local_b30,
             (shared_ptr<const_cxxopts::Value> *)local_a48,&local_5f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5f8._M_dataplus._M_p != &local_5f8.field_2) {
    operator_delete(local_5f8._M_dataplus._M_p,local_5f8.field_2._M_allocated_capacity + 1);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT44(local_a48._12_4_,local_a48._8_4_) !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               CONCAT44(local_a48._12_4_,local_a48._8_4_));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b30._M_dataplus._M_p != &local_b30.field_2) {
    operator_delete(local_b30._M_dataplus._M_p,local_b30.field_2._M_allocated_capacity + 1);
  }
  if (_Var29._M_p != &stack0xfffffffffffff468) {
    operator_delete(_Var29._M_p,in_stack_fffffffffffff468 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5d8._M_dataplus._M_p != &local_5d8.field_2) {
    operator_delete(local_5d8._M_dataplus._M_p,local_5d8.field_2._M_allocated_capacity + 1);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_988._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_988._8_8_);
  }
  if (p_Stack_a60 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_a60);
  }
  if ((element_type *)_Var30._M_p != (element_type *)&stack0xfffffffffffff4a8) {
    operator_delete(_Var30._M_p,in_stack_fffffffffffff4a8 + 1);
  }
  if (in_stack_fffffffffffff460._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(in_stack_fffffffffffff460._M_pi);
  }
  if ((element_type *)_Var33._M_p != (element_type *)&stack0xfffffffffffff488) {
    operator_delete(_Var33._M_p,in_stack_fffffffffffff488 + 1);
  }
  if (_Var28._M_p != &stack0xfffffffffffff448) {
    operator_delete(_Var28._M_p,in_stack_fffffffffffff448 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7a8._M_dataplus._M_p != &local_7a8.field_2) {
    operator_delete(local_7a8._M_dataplus._M_p,local_7a8.field_2._M_allocated_capacity + 1);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT44(local_a28._12_4_,local_a28._8_4_) !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               CONCAT44(local_a28._12_4_,local_a28._8_4_));
  }
  if ((undefined1 *)local_940._0_8_ != local_940 + 0x10) {
    operator_delete((void *)local_940._0_8_,stack0xfffffffffffff6d0 + 1);
  }
  if ((undefined1 *)local_718._0_8_ != local_718 + 0x10) {
    operator_delete((void *)local_718._0_8_,local_718._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5b8._M_dataplus._M_p != &local_5b8.field_2) {
    operator_delete(local_5b8._M_dataplus._M_p,local_5b8.field_2._M_allocated_capacity + 1);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      CONCAT44(local_a08.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi._4_4_,
               local_a08.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi._0_4_) != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               CONCAT44(local_a08.
                        super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi._4_4_,
                        local_a08.
                        super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi._0_4_));
  }
  if ((vector<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_> *)local_b10._0_8_ !=
      (vector<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_> *)local_b00) {
    operator_delete((void *)local_b10._0_8_,(ulong)(local_b00._0_8_ + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_518._M_dataplus._M_p != &local_518.field_2) {
    operator_delete(local_518._M_dataplus._M_p,local_518.field_2._M_allocated_capacity + 1);
  }
  if (_Stack_450._M_p != local_448 + 8) {
    operator_delete(_Stack_450._M_p,local_448._8_8_ + 1);
  }
  iVar10 = argc;
  if (local_9c8 != &local_9b8) {
    operator_delete(local_9c8,
                    CONCAT44(local_9b8._M_allocated_capacity._4_4_,
                             local_9b8._M_allocated_capacity._0_4_) + 1);
  }
  local_618._M_dataplus._M_p = (pointer)&local_618.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_618,"subword","");
  cxxopts::Options::parse_positional((Options *)local_1a8,&local_618);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_618._M_dataplus._M_p != &local_618.field_2) {
    operator_delete(local_618._M_dataplus._M_p,local_618.field_2._M_allocated_capacity + 1);
  }
  _Stack_450._M_p = local_1a8 + 0xa8;
  local_428._M_allocated_capacity = (size_type)auStack_3f8;
  local_458 = (undefined1  [8])local_1a8._152_8_;
  local_448._0_8_ = (pointer)0x0;
  local_448._8_8_ = 0;
  aStack_438._0_8_ = 0;
  aStack_438._M_local_buf[8] = local_1a8[0x81];
  local_428._8_8_ = 1;
  local_418._M_allocated_capacity = 0;
  local_418._8_8_ = 0;
  local_408._M_allocated_capacity = 0x3f800000;
  auStack_3f8._8_8_ = apeStack_3c0;
  local_408._8_8_ = 0;
  auStack_3f8._0_8_ = (__node_base_ptr)0x0;
  aStack_3e8._M_allocated_capacity = 1;
  aStack_3e8._8_8_ = (_Hash_node_base *)0x0;
  aStack_3d8._M_allocated_capacity = 0;
  aStack_3d8._8_8_ = 0x3f800000;
  local_3c8 = 0;
  apeStack_3c0[0] = (element_type *)0x0;
  cxxopts::OptionParser::parse((ParseResult *)local_718,(OptionParser *)local_458,argc,argv);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)(auStack_3f8 + 8));
  std::
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_cxxopts::OptionValue>,_std::allocator<std::pair<const_unsigned_long,_cxxopts::OptionValue>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_cxxopts::OptionValue>,_std::allocator<std::pair<const_unsigned_long,_cxxopts::OptionValue>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)&local_428);
  std::vector<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_>::~vector
            ((vector<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_> *)local_448);
  local_458 = (undefined1  [8])local_448;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_458,"help","");
  sVar12 = cxxopts::ParseResult::count((ParseResult *)local_718,(string *)local_458);
  if (local_458 != (undefined1  [8])local_448) {
    operator_delete((void *)local_458,(ulong)(local_448._0_8_ + 1));
  }
  if (sVar12 != 0) {
    local_518._M_dataplus._M_p = (pointer)0x0;
    local_518._M_string_length = 0;
    local_518.field_2._M_allocated_capacity = 0;
    cxxopts::Options::help
              ((string *)local_458,(Options *)local_1a8,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_518);
    poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,(char *)local_458,(long)_Stack_450._M_p);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar13 + -0x18) + (char)poVar13);
    std::ostream::put((char)poVar13);
    std::ostream::flush();
    if (local_458 != (undefined1  [8])local_448) {
      operator_delete((void *)local_458,(ulong)(local_448._0_8_ + 1));
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_518);
    uVar23 = 0;
    goto LAB_0010bd41;
  }
  build_tokenization_options(&local_250,(ParseResult *)local_718);
  uVar34 = (undefined4)((ulong)_Var33._M_p >> 0x20);
  uVar32 = SUB84(_Var33._M_p,0);
  local_458 = (undefined1  [8])0x0;
  _Stack_450._M_p = (pointer)0x0;
  OVar7.lang._M_dataplus._M_p._0_4_ = iVar10;
  OVar7._0_8_ = in_stack_fffffffffffff428;
  OVar7.lang._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff434;
  OVar7.lang._M_string_length._0_4_ = (int)_Var28._M_p;
  OVar7.lang._M_string_length._4_4_ = (int)((ulong)_Var28._M_p >> 0x20);
  OVar7.lang.field_2._M_allocated_capacity._0_4_ = in_stack_fffffffffffff440;
  OVar7.lang.field_2._M_allocated_capacity._4_4_ = in_stack_fffffffffffff444;
  OVar7.lang.field_2._8_8_ = in_stack_fffffffffffff448;
  OVar7.no_substitution = (bool)(char)in_stack_fffffffffffff450;
  OVar7.case_feature = (bool)(char)((ulong)in_stack_fffffffffffff450 >> 8);
  OVar7.case_markup = (bool)(char)((ulong)in_stack_fffffffffffff450 >> 0x10);
  OVar7.soft_case_regions = (bool)(char)((ulong)in_stack_fffffffffffff450 >> 0x18);
  OVar7.with_separators = (bool)(char)((ulong)in_stack_fffffffffffff450 >> 0x20);
  OVar7.allow_isolated_marks = (bool)(char)((ulong)in_stack_fffffffffffff450 >> 0x28);
  OVar7.joiner_annotate = (bool)(char)((ulong)in_stack_fffffffffffff450 >> 0x30);
  OVar7.joiner_new = (bool)(char)((ulong)in_stack_fffffffffffff450 >> 0x38);
  OVar7.joiner._M_dataplus._M_p = _Var29._M_p;
  OVar7.joiner._M_string_length = (size_type)p_Var31;
  OVar7.joiner.field_2._M_allocated_capacity = in_stack_fffffffffffff468;
  OVar7.joiner.field_2._8_8_ = in_stack_fffffffffffff470;
  OVar7.spacer_annotate = (bool)(char)uVar32;
  OVar7.spacer_new = (bool)(char)((uint)uVar32 >> 8);
  OVar7.preserve_placeholders = (bool)(char)((uint)uVar32 >> 0x10);
  OVar7.preserve_segmented_tokens = (bool)(char)((uint)uVar32 >> 0x18);
  OVar7.support_prior_joiners = (bool)(char)uVar34;
  OVar7.segment_case = (bool)(char)((uint)uVar34 >> 8);
  OVar7.segment_numbers = (bool)(char)((uint)uVar34 >> 0x10);
  OVar7.segment_alphabet_change = (bool)(char)((uint)uVar34 >> 0x18);
  OVar7.segment_alphabet.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start._0_4_ = uVar26;
  OVar7.segment_alphabet.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start._4_4_ = uVar27;
  OVar7.segment_alphabet.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffff488;
  OVar7.segment_alphabet.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffff490;
  OVar7.segment_alphabet_codes._M_h._M_buckets = (__buckets_ptr)_Var30._M_p;
  OVar7.segment_alphabet_codes._M_h._M_bucket_count = (size_type)_Var36._M_pi;
  OVar7.segment_alphabet_codes._M_h._M_before_begin._M_nxt =
       (_Hash_node_base *)in_stack_fffffffffffff4a8;
  auVar37 = in_stack_fffffffffffff4b0._8_16_;
  OVar7.segment_alphabet_codes._M_h._M_element_count = in_stack_fffffffffffff4b0._0_8_;
  OVar7.segment_alphabet_codes._M_h._M_rehash_policy._M_max_load_factor = (float)auVar37._0_4_;
  OVar7.segment_alphabet_codes._M_h._M_rehash_policy._4_4_ = auVar37._4_4_;
  OVar7.segment_alphabet_codes._M_h._M_rehash_policy._M_next_resize = auVar37._8_8_;
  OVar7.segment_alphabet_codes._M_h._M_single_bucket = (__node_base_ptr)argv;
  onmt::Tokenizer::Tokenizer((Tokenizer *)&local_518,OVar7,(shared_ptr *)&local_250);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Stack_450._M_p !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Stack_450._M_p);
  }
  std::
  _Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&local_250.segment_alphabet_codes._M_h);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_250.segment_alphabet);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250.joiner._M_dataplus._M_p != &local_250.joiner.field_2) {
    operator_delete(local_250.joiner._M_dataplus._M_p,
                    local_250.joiner.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250.lang._M_dataplus._M_p != &local_250.lang.field_2) {
    operator_delete(local_250.lang._M_dataplus._M_p,local_250.lang.field_2._M_allocated_capacity + 1
                   );
  }
  local_458 = (undefined1  [8])local_448;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_458,"subword","");
  pOVar14 = cxxopts::ParseResult::operator[]((ParseResult *)local_718,(string *)local_458);
  pvVar15 = cxxopts::OptionValue::
            as<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>(pOVar14);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_8a0,pvVar15);
  if (local_458 != (undefined1  [8])local_448) {
    operator_delete((void *)local_458,(ulong)(local_448._0_8_ + 1));
  }
  pbVar24 = local_8a0.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  iVar10 = std::__cxx11::string::compare
                     ((char *)local_8a0.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
  if (iVar10 == 0) {
    local_638._M_dataplus._M_p = (pointer)&local_638.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_638,"subword_learn [OPTION...] -- bpe","");
    local_658._M_dataplus._M_p = (pointer)&local_658.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_658,"");
    cxxopts::Options::Options((Options *)local_458,&local_638,&local_658);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_658._M_dataplus._M_p != &local_658.field_2) {
      operator_delete(local_658._M_dataplus._M_p,local_658.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_638._M_dataplus._M_p != &local_638.field_2) {
      operator_delete(local_638._M_dataplus._M_p,local_638.field_2._M_allocated_capacity + 1);
    }
    local_9e8._M_pi = &local_9d8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_9e8,"");
    uVar23 = (uint)local_9d8._vptr__Sp_counted_base;
    local_b00._0_8_ = local_9e0;
    if (local_9e8._M_pi == &local_9d8) {
      uStack_928 = local_9d8._M_use_count;
      uStack_924 = local_9d8._M_weak_count;
      local_9e8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_940 + 0x10);
    }
    uStack_92c = local_9d8._vptr__Sp_counted_base._4_4_;
    local_940._16_4_ = (uint)local_9d8._vptr__Sp_counted_base;
    local_9e0 = (pointer)0x0;
    local_9d8._vptr__Sp_counted_base._0_4_ = (uint)local_9d8._vptr__Sp_counted_base & 0xffffff00;
    local_b10._8_8_ = local_b00 + 8;
    if (local_9e8._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_940 + 0x10)) {
      local_b00._8_8_ = CONCAT44(local_9d8._vptr__Sp_counted_base._4_4_,uVar23);
      local_b00._20_4_ = uStack_924;
      local_b00._16_4_ = uStack_928;
    }
    else {
      local_b00._8_8_ = stack0xfffffffffffff6d0;
      local_b10._8_8_ = local_9e8._M_pi;
    }
    local_940._0_8_ = local_940 + 0x10;
    local_b10._0_8_ = (Options *)local_458;
    local_9e8._M_pi = &local_9d8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_940,"h,help","");
    _Var28._M_p = &stack0xfffffffffffff448;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&stack0xfffffffffffff438,"Show this help","");
    std::__shared_ptr<cxxopts::values::standard_value<bool>,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<std::allocator<cxxopts::values::standard_value<bool>>>
              ((__shared_ptr<cxxopts::values::standard_value<bool>,(__gnu_cxx::_Lock_policy)2> *)
               &stack0xfffffffffffff478,
               (allocator<cxxopts::values::standard_value<bool>_> *)&stack0xfffffffffffff498);
    local_7c8._M_dataplus._M_p = (pointer)&local_7c8.field_2;
    local_748.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
    ._0_4_ = uVar26;
    local_748.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
    ._4_4_ = uVar27;
    local_748.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)_Var33._M_p;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_7c8,"");
    pOVar11 = cxxopts::OptionAdder::operator()
                        ((OptionAdder *)local_b10,(string *)local_940,
                         (string *)&stack0xfffffffffffff438,&local_748,&local_7c8);
    _Var33._M_p = &stack0xfffffffffffff488;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&stack0xfffffffffffff478,"s,symbols","");
    _Var35._M_p = &stack0xfffffffffffff4a8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&stack0xfffffffffffff498,
               "Create this many new symbols (each representing a character n-gram)","");
    std::__shared_ptr<cxxopts::values::standard_value<int>,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<std::allocator<cxxopts::values::standard_value<int>>>
              ((__shared_ptr<cxxopts::values::standard_value<int>,(__gnu_cxx::_Lock_policy)2> *)
               &stack0xfffffffffffff458,
               (allocator<cxxopts::values::standard_value<int>_> *)&local_b30);
    _Var30._M_p = &stack0xfffffffffffff468;
    uVar26 = SUB84(p_Var31,0);
    uVar27 = (undefined4)((ulong)p_Var31 >> 0x20);
    std::__cxx11::string::_M_construct<char_const*>((string *)&stack0xfffffffffffff458,"10000","");
    (**(code **)(*(long *)_Var29._M_p + 0x50))(&local_858,_Var29._M_p,&stack0xfffffffffffff458);
    local_758.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         local_858;
    local_758.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         = p_Stack_850;
    local_858 = (element_type *)0x0;
    p_Stack_850 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_7e8._M_dataplus._M_p = (pointer)&local_7e8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_7e8,"");
    pOVar11 = cxxopts::OptionAdder::operator()
                        (pOVar11,(string *)&stack0xfffffffffffff478,
                         (string *)&stack0xfffffffffffff498,&local_758,&local_7e8);
    local_b30._M_dataplus._M_p = (pointer)&local_b30.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b30,"min-frequency","");
    local_968._0_8_ = local_968 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_968,"Stop if no symbol pair has frequency >= FREQ","");
    std::__shared_ptr<cxxopts::values::standard_value<int>,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<std::allocator<cxxopts::values::standard_value<int>>>
              ((__shared_ptr<cxxopts::values::standard_value<int>,(__gnu_cxx::_Lock_policy)2> *)
               &local_a08,(allocator<cxxopts::values::standard_value<int>_> *)local_a28);
    peVar8 = local_a08.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_a08.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_9f8;
    p_Var38 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
              CONCAT44(local_a08.
                       super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi._4_4_,
                       local_a08.
                       super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi._0_4_);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a08,"2","");
    (*peVar8->_vptr_Value[10])(&local_868,peVar8,&local_a08);
    local_768.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         local_868;
    local_768.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         = p_Stack_860;
    local_868 = (element_type *)0x0;
    p_Stack_860 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_808._M_dataplus._M_p = (pointer)&local_808.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_808,"");
    pOVar11 = cxxopts::OptionAdder::operator()
                        (pOVar11,&local_b30,(string *)local_968,&local_768,&local_808);
    local_a28._0_8_ = local_a28 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_a28,"dict-input","");
    local_988._0_8_ = (element_type *)(local_988 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_988,
               "If set, input file is interpreted as a dictionary where each line contains a word-count pair"
               ,"");
    std::__shared_ptr<cxxopts::values::standard_value<bool>,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<std::allocator<cxxopts::values::standard_value<bool>>>
              ((__shared_ptr<cxxopts::values::standard_value<bool>,(__gnu_cxx::_Lock_policy)2> *)
               &local_a68,(allocator<cxxopts::values::standard_value<bool>_> *)local_a48);
    peVar8 = local_a68;
    local_a68 = (element_type *)local_a58;
    local_a70 = p_Stack_a60;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a68,"false","");
    (*peVar8->_vptr_Value[10])(&local_878,peVar8,&local_a68);
    local_778.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         local_878;
    local_778.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         = p_Stack_870;
    local_878 = (element_type *)0x0;
    p_Stack_870 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_828._M_dataplus._M_p = (pointer)&local_828.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_828,"");
    pOVar11 = cxxopts::OptionAdder::operator()
                        (pOVar11,(string *)local_a28,(string *)local_988,&local_778,&local_828);
    local_a48._0_8_ = local_a48 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_a48,"t,total-symbols","");
    local_848._M_dataplus._M_p = (pointer)&local_848.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_848,
               "Subtract number of characters from the symbols to be generated (so that \'--symbols\' becomes an estimate for the total number of symbols needed to encode text)"
               ,"");
    std::__shared_ptr<cxxopts::values::standard_value<bool>,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<std::allocator<cxxopts::values::standard_value<bool>>>
              ((__shared_ptr<cxxopts::values::standard_value<bool>,(__gnu_cxx::_Lock_policy)2> *)
               &local_738,
               (allocator<cxxopts::values::standard_value<bool>_> *)&stack0xfffffffffffff4c7);
    plVar9 = local_738;
    local_738 = local_728;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_738,"false","");
    (**(code **)(*plVar9 + 0x50))(&local_888,plVar9,&local_738);
    local_788.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         local_888;
    local_788.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         = p_Stack_880;
    local_888 = (element_type *)0x0;
    p_Stack_880 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_678._M_dataplus._M_p = (pointer)&local_678.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_678,"");
    cxxopts::OptionAdder::operator()(pOVar11,(string *)local_a48,&local_848,&local_788,&local_678);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_678._M_dataplus._M_p != &local_678.field_2) {
      operator_delete(local_678._M_dataplus._M_p,local_678.field_2._M_allocated_capacity + 1);
    }
    if (local_788.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_788.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if (p_Stack_880 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_880);
    }
    if (local_738 != local_728) {
      operator_delete(local_738,local_728[0] + 1);
    }
    if (local_730 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_730);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_848._M_dataplus._M_p != &local_848.field_2) {
      operator_delete(local_848._M_dataplus._M_p,local_848.field_2._M_allocated_capacity + 1);
    }
    p_Var31 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT44(uVar27,uVar26);
    if ((element_type *)local_a48._0_8_ != (element_type *)(local_a48 + 0x10)) {
      operator_delete((void *)local_a48._0_8_,local_a48._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_828._M_dataplus._M_p != &local_828.field_2) {
      operator_delete(local_828._M_dataplus._M_p,local_828.field_2._M_allocated_capacity + 1);
    }
    if (local_778.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_778.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if (p_Stack_870 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_870);
    }
    if (local_a68 != (element_type *)local_a58) {
      operator_delete(local_a68,local_a58._0_8_ + 1);
    }
    if (local_a70 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_a70);
    }
    if ((element_type *)local_988._0_8_ != (element_type *)(local_988 + 0x10)) {
      operator_delete((void *)local_988._0_8_,local_988._16_8_ + 1);
    }
    if ((element_type *)local_a28._0_8_ != (element_type *)(local_a28 + 0x10)) {
      operator_delete((void *)local_a28._0_8_,local_a28._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_808._M_dataplus._M_p != &local_808.field_2) {
      operator_delete(local_808._M_dataplus._M_p,local_808.field_2._M_allocated_capacity + 1);
    }
    if (local_768.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_768.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if (p_Stack_860 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_860);
    }
    if (local_a08.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)local_9f8) {
      operator_delete(local_a08.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr,local_9f8._0_8_ + 1);
    }
    if (p_Var38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var38);
    }
    if ((element_type *)local_968._0_8_ != (element_type *)(local_968 + 0x10)) {
      operator_delete((void *)local_968._0_8_,local_968._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b30._M_dataplus._M_p != &local_b30.field_2) {
      operator_delete(local_b30._M_dataplus._M_p,local_b30.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_7e8._M_dataplus._M_p != &local_7e8.field_2) {
      operator_delete(local_7e8._M_dataplus._M_p,local_7e8.field_2._M_allocated_capacity + 1);
    }
    if (local_758.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_758.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if (p_Stack_850 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_850);
    }
    if (_Var30._M_p != &stack0xfffffffffffff468) {
      operator_delete(_Var30._M_p,in_stack_fffffffffffff468 + 1);
    }
    if (p_Var31 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var31);
    }
    if ((element_type *)_Var35._M_p != (element_type *)&stack0xfffffffffffff4a8) {
      operator_delete(_Var35._M_p,in_stack_fffffffffffff4a8 + 1);
    }
    if ((element_type *)_Var33._M_p != (element_type *)&stack0xfffffffffffff488) {
      operator_delete(_Var33._M_p,in_stack_fffffffffffff488 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_7c8._M_dataplus._M_p != &local_7c8.field_2) {
      operator_delete(local_7c8._M_dataplus._M_p,local_7c8.field_2._M_allocated_capacity + 1);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        CONCAT44(local_748.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi._4_4_,
                 local_748.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi._0_4_) != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 CONCAT44(local_748.
                          super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi._4_4_,
                          local_748.
                          super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi._0_4_));
    }
    if (_Var28._M_p != &stack0xfffffffffffff448) {
      operator_delete(_Var28._M_p,in_stack_fffffffffffff448 + 1);
    }
    if ((undefined1 *)local_940._0_8_ != local_940 + 0x10) {
      operator_delete((void *)local_940._0_8_,(ulong)(stack0xfffffffffffff6d0 + 1));
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b10._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_b00 + 8)) {
      operator_delete((void *)local_b10._8_8_,(ulong)(local_b00._8_8_ + 1));
    }
    if (local_9e8._M_pi != &local_9d8) {
      operator_delete(local_9e8._M_pi,
                      CONCAT44(local_9d8._vptr__Sp_counted_base._4_4_,
                               (uint)local_9d8._vptr__Sp_counted_base) + 1);
    }
    lVar18 = ((long)local_8a0.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
             (long)local_8a0.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start) * 0x8000000;
    uVar21 = 0xffffffffffffffff;
    if (-1 < lVar18) {
      uVar21 = lVar18 >> 0x1d;
    }
    argv_00 = (char **)operator_new__(uVar21);
    uVar23 = (uint)((ulong)((long)local_8a0.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)local_8a0.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 5);
    if (0 < (int)uVar23) {
      uVar21 = 0;
      do {
        argv_00[uVar21] =
             ((local_8a0.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p;
        uVar21 = uVar21 + 1;
        local_8a0.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             local_8a0.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + 1;
      } while ((uVar23 & 0x7fffffff) != uVar21);
    }
    local_b10._8_8_ = local_3b0;
    local_ae0._M_buckets = &local_ae0._M_single_bucket;
    local_b10._0_8_ = apeStack_3c0[0];
    local_b00._0_8_ = (pointer)0x0;
    local_b00._8_8_ = (pointer)0x0;
    local_b00._16_8_ = (pointer)0x0;
    local_ae8 = (bool)aStack_3d8._M_local_buf[1];
    local_ae0._M_bucket_count = 1;
    local_ae0._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_ae0._M_element_count = 0;
    local_ae0._M_rehash_policy._M_max_load_factor = 1.0;
    local_ae0._M_rehash_policy._4_4_ = 0;
    local_aa8._M_buckets = &local_aa8._M_single_bucket;
    local_ae0._M_rehash_policy._M_next_resize = 0;
    local_ae0._M_single_bucket = (__node_base_ptr)0x0;
    local_aa8._M_bucket_count = 1;
    local_aa8._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_aa8._M_element_count = 0;
    local_aa8._M_rehash_policy._M_max_load_factor = 1.0;
    local_aa8._M_rehash_policy._4_4_ = 0;
    local_aa8._M_rehash_policy._M_next_resize = 0;
    local_aa8._M_single_bucket = (__node_base_ptr)0x0;
    cxxopts::OptionParser::parse((ParseResult *)local_940,(OptionParser *)local_b10,uVar23,argv_00);
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable(&local_aa8);
    std::
    _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_cxxopts::OptionValue>,_std::allocator<std::pair<const_unsigned_long,_cxxopts::OptionValue>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable(&local_ae0);
    std::vector<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_>::~vector
              ((vector<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_> *)local_b00);
    operator_delete__(argv_00);
    local_b10._0_8_ = (vector<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_> *)local_b00;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_b10,"help","");
    sVar12 = cxxopts::ParseResult::count((ParseResult *)local_940,(string *)local_b10);
    if ((vector<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_> *)local_b10._0_8_ !=
        (vector<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_> *)local_b00) {
      operator_delete((void *)local_b10._0_8_,(ulong)(local_b00._0_8_ + 1));
    }
    if (sVar12 == 0) {
      pvVar19 = operator_new(0x68);
      uVar26 = SUB84(pvVar19,0);
      uVar27 = (undefined4)((ulong)pvVar19 >> 0x20);
      local_b10._0_8_ = local_b00;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_b10,"verbose","");
      pOVar14 = cxxopts::ParseResult::operator[]((ParseResult *)local_718,(string *)local_b10);
      pbVar16 = cxxopts::OptionValue::as<bool>(pOVar14);
      bVar25 = *pbVar16;
      _Var28._M_p = &stack0xfffffffffffff448;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&stack0xfffffffffffff438,"symbols","");
      pOVar14 = cxxopts::ParseResult::operator[]
                          ((ParseResult *)local_940,(string *)&stack0xfffffffffffff438);
      piVar20 = cxxopts::OptionValue::as<int>(pOVar14);
      iVar10 = *piVar20;
      _Var33._M_p = &stack0xfffffffffffff488;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&stack0xfffffffffffff478,"min-frequency","");
      pOVar14 = cxxopts::ParseResult::operator[]
                          ((ParseResult *)local_940,(string *)&stack0xfffffffffffff478);
      piVar20 = cxxopts::OptionValue::as<int>(pOVar14);
      iVar3 = *piVar20;
      _Var30._M_p = &stack0xfffffffffffff4a8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&stack0xfffffffffffff498,"dict-input","");
      pOVar14 = cxxopts::ParseResult::operator[]
                          ((ParseResult *)local_940,(string *)&stack0xfffffffffffff498);
      pbVar16 = cxxopts::OptionValue::as<bool>(pOVar14);
      bVar2 = *pbVar16;
      _Var29._M_p = &stack0xfffffffffffff468;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&stack0xfffffffffffff458,"total-symbols","");
      pOVar14 = cxxopts::ParseResult::operator[]
                          ((ParseResult *)local_940,(string *)&stack0xfffffffffffff458);
      pbVar16 = cxxopts::OptionValue::as<bool>(pOVar14);
      onmt::BPELearner::BPELearner
                ((BPELearner *)CONCAT44(uVar27,uVar26),bVar25,iVar10,iVar3,bVar2,*pbVar16);
      if (_Var29._M_p != &stack0xfffffffffffff468) {
        operator_delete(_Var29._M_p,in_stack_fffffffffffff468 + 1);
      }
      if ((element_type *)_Var30._M_p != (element_type *)&stack0xfffffffffffff4a8) {
        operator_delete(_Var30._M_p,in_stack_fffffffffffff4a8 + 1);
      }
      if ((element_type *)_Var33._M_p != (element_type *)&stack0xfffffffffffff488) {
        operator_delete(_Var33._M_p,in_stack_fffffffffffff488 + 1);
      }
      if (_Var28._M_p != &stack0xfffffffffffff448) {
        operator_delete(_Var28._M_p,in_stack_fffffffffffff448 + 1);
      }
      if ((vector<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_> *)local_b10._0_8_ !=
          (vector<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_> *)local_b00) {
        operator_delete((void *)local_b10._0_8_,(ulong)(local_b00._0_8_ + 1));
      }
    }
    else {
      cxxopts::Options::help
                ((string *)local_b10,(Options *)local_458,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&stack0xfffffffffffff438);
      poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,(char *)local_b10._0_8_,local_b10._8_8_);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar13 + -0x18) + (char)poVar13);
      std::ostream::put((char)poVar13);
      std::ostream::flush();
      if ((vector<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_> *)local_b10._0_8_ !=
          (vector<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_> *)local_b00) {
        operator_delete((void *)local_b10._0_8_,(ulong)(local_b00._0_8_ + 1));
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&stack0xfffffffffffff438);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_8b8);
    std::vector<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_>::~vector(&local_8d0);
    std::
    _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_cxxopts::OptionValue>,_std::allocator<std::pair<const_unsigned_long,_cxxopts::OptionValue>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable(&local_908);
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)local_940);
    cxxopts::Options::~Options((Options *)local_458);
    uVar23 = 0;
    if (sVar12 == 0) {
      local_458 = (undefined1  [8])local_448;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_458,"input","");
      sVar12 = cxxopts::ParseResult::count((ParseResult *)local_718,(string *)local_458);
      if (local_458 != (undefined1  [8])local_448) {
        operator_delete((void *)local_458,(ulong)(local_448._0_8_ + 1));
      }
      if (sVar12 == 0) {
        (**(code **)(*(long *)CONCAT44(uVar27,uVar26) + 0x28))
                  ((long *)CONCAT44(uVar27,uVar26),&std::cin,&local_518);
      }
      else {
        local_458 = (undefined1  [8])local_448;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_458,"input","");
        pOVar14 = cxxopts::ParseResult::operator[]((ParseResult *)local_718,(string *)local_458);
        pvVar15 = cxxopts::OptionValue::
                  as<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                            (pOVar14);
        if (local_458 != (undefined1  [8])local_448) {
          operator_delete((void *)local_458,(ulong)(local_448._0_8_ + 1));
        }
        pbVar24 = (pvVar15->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        pbVar5 = (pvVar15->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
        if (pbVar24 != pbVar5) {
          do {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Parsing ",8);
            poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cerr,(pbVar24->_M_dataplus)._M_p,
                                 pbVar24->_M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar13,"...",3);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar13 + -0x18) + (char)poVar13);
            std::ostream::put((char)poVar13);
            std::ostream::flush();
            std::ifstream::ifstream(local_458);
            std::ifstream::open(local_458,(_Ios_Openmode)(pbVar24->_M_dataplus)._M_p);
            std::istream::seekg(local_458,0,0);
            if (*(int *)((long)&aStack_438 + *(long *)((long)local_458 + -0x18)) != 0) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"ERROR: cannot open file ",0x18);
              poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&std::cout,(pbVar24->_M_dataplus)._M_p,
                                   pbVar24->_M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar13," for reading ",0xd);
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar13 + -0x18) + (char)poVar13);
              std::ostream::put((char)poVar13);
              std::ostream::flush();
              std::ifstream::~ifstream(local_458);
              goto LAB_0010aaaf;
            }
            (**(code **)(*(long *)CONCAT44(uVar27,uVar26) + 0x28))
                      ((long *)CONCAT44(uVar27,uVar26),local_458,&local_518);
            std::ifstream::~ifstream(local_458);
            pbVar24 = pbVar24 + 1;
          } while (pbVar24 != pbVar5);
        }
      }
      std::ofstream::ofstream(local_458);
      local_b10._0_8_ = local_b00;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_b10,"output","");
      sVar12 = cxxopts::ParseResult::count((ParseResult *)local_718,(string *)local_b10);
      if ((vector<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_> *)local_b10._0_8_ !=
          (vector<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_> *)local_b00) {
        operator_delete((void *)local_b10._0_8_,(ulong)(local_b00._0_8_ + 1));
      }
      if (sVar12 == 0) {
        pcVar22 = (char *)&std::cout;
LAB_0010bc5f:
        uVar23 = 0;
        (**(code **)(*(long *)CONCAT44(uVar27,uVar26) + 0x30))
                  ((long *)CONCAT44(uVar27,uVar26),pcVar22,"Generated with subword_learn cli",0);
      }
      else {
        local_940._0_8_ = local_940 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_940,"output","");
        pOVar14 = cxxopts::ParseResult::operator[]((ParseResult *)local_718,(string *)local_940);
        pbVar17 = cxxopts::OptionValue::as<std::__cxx11::string>(pOVar14);
        local_b10._0_8_ = local_b00;
        pcVar6 = (pbVar17->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_b10,pcVar6,pcVar6 + pbVar17->_M_string_length);
        if ((undefined1 *)local_940._0_8_ != local_940 + 0x10) {
          operator_delete((void *)local_940._0_8_,(ulong)(stack0xfffffffffffff6d0 + 1));
        }
        pcVar22 = local_458;
        std::ofstream::open(pcVar22,(_Ios_Openmode)local_b10._0_8_);
        uVar4 = *(uint *)((long)&aStack_438 + *(long *)((long)local_458 + -0x18));
        bVar25 = (uVar4 & 5) != 0;
        if (bVar25) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"ERROR: cannot open file ",0x18);
          pcVar22 = (char *)&std::cout;
          poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,(char *)local_b10._0_8_,local_b10._8_8_);
          std::__ostream_insert<char,std::char_traits<char>>(poVar13," for writing ",0xd);
          std::endl<char,std::char_traits<char>>(poVar13);
        }
        uVar23 = (uint)bVar25;
        if ((vector<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_> *)local_b10._0_8_ !=
            (vector<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_> *)local_b00) {
          operator_delete((void *)local_b10._0_8_,(ulong)(local_b00._0_8_ + 1));
        }
        if ((uVar4 & 5) == 0) goto LAB_0010bc5f;
      }
      local_458 = (undefined1  [8])_VTT;
      *(undefined8 *)(local_458 + *(long *)&_VTT[-1].m_option_map._M_h._M_rehash_policy) = _memcpy;
      std::filebuf::~filebuf((filebuf *)&_Stack_450);
      std::ios_base::~ios_base(local_360);
    }
  }
  else {
    iVar10 = std::__cxx11::string::compare((char *)pbVar24);
    if (iVar10 == 0) {
      this = (SentencePieceLearner *)operator_new(0x78);
      local_458 = (undefined1  [8])local_448;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_458,"verbose","");
      pOVar14 = cxxopts::ParseResult::operator[]((ParseResult *)local_718,(string *)local_458);
      pbVar16 = cxxopts::OptionValue::as<bool>(pOVar14);
      bVar25 = *pbVar16;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      vector<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_940,
                 local_8a0.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + 1,
                 (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  )local_8a0.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish,
                 (allocator_type *)&stack0xfffffffffffff438);
      local_b10._0_8_ = (vector<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_> *)local_b00;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_b10,"tmpfile","");
      pOVar14 = cxxopts::ParseResult::operator[]((ParseResult *)local_718,(string *)local_b10);
      pbVar17 = cxxopts::OptionValue::as<std::__cxx11::string>(pOVar14);
      onmt::SentencePieceLearner::SentencePieceLearner
                (this,bVar25,(vector *)local_940,(string *)pbVar17,false,false);
      if ((vector<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_> *)local_b10._0_8_ !=
          (vector<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_> *)local_b00) {
        operator_delete((void *)local_b10._0_8_,(ulong)(local_b00._0_8_ + 1));
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_940);
      if (local_458 != (undefined1  [8])local_448) {
        operator_delete((void *)local_458,(ulong)(local_448._0_8_ + 1));
      }
LAB_0010aaaf:
      uVar23 = 1;
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"ERROR: invalid subword type: ",0x1d);
      poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,(pbVar24->_M_dataplus)._M_p,
                           pbVar24->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar13," (accepted: bpe, sentencepiece)",0x1f);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar13 + -0x18) + (char)poVar13);
      std::ostream::put((char)poVar13);
      uVar23 = 1;
      std::ostream::flush();
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_8a0);
  local_518._M_dataplus._M_p = (pointer)std::ofstream::ofstream;
  if (local_460 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_460);
  }
  std::
  _Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&local_4a0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_4b8);
  if (local_4e0 != local_4d0) {
    operator_delete(local_4e0,local_4d0[0] + 1);
  }
  if ((long *)local_518.field_2._M_allocated_capacity != local_4f8) {
    operator_delete((void *)local_518.field_2._M_allocated_capacity,local_4f8[0] + 1);
  }
LAB_0010bd41:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_690);
  std::vector<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_>::~vector(&local_6a8);
  std::
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_cxxopts::OptionValue>,_std::allocator<std::pair<const_unsigned_long,_cxxopts::OptionValue>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_6e0);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)local_718);
  cxxopts::Options::~Options((Options *)local_1a8);
  return uVar23;
}

Assistant:

int main(int argc, char* argv[])
{
  cxxopts::Options cmd_options("subword_learn",
                               "Subword learning script.\n\nsubword_learn "
                               "[TOKENIZATION_OPTIONS...] -- [SUBWORD_TYPE] "
                               "[SUBWORD_OPTIONS...] < input_file > output_file\n");
  cmd_options.add_options()
    ("h,help", "Show this help")
    ("v,verbose", "Enable verbose output",
     cxxopts::value<bool>()->default_value("false"))
    ;

  add_tokenization_options(cmd_options);

  cmd_options.add_options("Subword learning")
    ("i,input", "Input files (if not set, the standard input is used)",
     cxxopts::value<std::vector<std::string>>())
    ("o,output", "Output file (if not set, the standard output is used)",
     cxxopts::value<std::string>())
    ("tmpfile", "Temporary file for file-based learner",
     cxxopts::value<std::string>()->default_value("input.tmp"))
    ("subword", "Arguments for subword learner",
     cxxopts::value<std::vector<std::string>>());

  cmd_options.parse_positional("subword");

  auto vm = cmd_options.parse(argc, argv);

  if (vm.count("help"))
  {
    std::cout << cmd_options.help() << std::endl;
    return 0;
  }

  onmt::Tokenizer tokenizer(build_tokenization_options(vm));
  onmt::SubwordLearner *learner;

  const auto subword_args = vm["subword"].as<std::vector<std::string>>();
  const auto& subword = subword_args[0];
  if (subword == "bpe")
  {
    cxxopts::Options bpe_options("subword_learn [OPTION...] -- bpe");
    bpe_options.add_options()
      ("h,help", "Show this help")
      ("s,symbols", "Create this many new symbols (each representing a character n-gram)",
       cxxopts::value<int>()->default_value("10000"))
      ("min-frequency", "Stop if no symbol pair has frequency >= FREQ",
       cxxopts::value<int>()->default_value("2"))
      ("dict-input",
       "If set, input file is interpreted as a dictionary where each line "
       "contains a word-count pair",
       cxxopts::value<bool>()->default_value("false"))
      ("t,total-symbols",
       "Subtract number of characters from the symbols to be generated "
       "(so that '--symbols' becomes an estimate for the total number of "
       "symbols needed to encode text)",
       cxxopts::value<bool>()->default_value("false"))
      ;

    // Parse BPE options only.
    int subargc = subword_args.size();
    char** subargv = new char*[subargc];
    for (int i = 0; i < subargc; ++i)
      subargv[i] = const_cast<char*>(subword_args[i].c_str());
    auto subvm = bpe_options.parse(subargc, subargv);
    delete [] subargv;

    if (subvm.count("help"))
    {
      std::cout << bpe_options.help() << std::endl;
      return 0;
    }

    learner = new onmt::BPELearner(vm["verbose"].as<bool>(),
                                   subvm["symbols"].as<int>(),
                                   subvm["min-frequency"].as<int>(),
                                   subvm["dict-input"].as<bool>(),
                                   subvm["total-symbols"].as<bool>());

  }
  else if (subword == "sentencepiece") {
    learner = new onmt::SentencePieceLearner(vm["verbose"].as<bool>(),
                                             std::vector<std::string>(subword_args.begin() + 1,
                                                                      subword_args.end()),
                                             vm["tmpfile"].as<std::string>());
    return 1;
  }
  else {
    std::cerr << "ERROR: invalid subword type: " << subword << " (accepted: bpe, sentencepiece)" << std::endl;
    return 1;
  }

  if (vm.count("input")) {
    for(const std::string &inputFileName: vm["input"].as<std::vector<std::string> >()) {
      std::cerr << "Parsing " << inputFileName << "..." << std::endl;
      std::ifstream inputFile;
      inputFile.open(inputFileName.c_str());
      inputFile.seekg(0);
      if (inputFile.fail() || !inputFile.good()) {
        std::cout << "ERROR: cannot open file " << inputFileName << " for reading " << std::endl;
        return 1;
      }
      learner->ingest(inputFile, &tokenizer);
    }
  } else
    learner->ingest(std::cin, &tokenizer);

  std::ostream* pCout = &std::cout;
  std::ofstream outputFile;
  if (vm.count("output")) {
    std::string outputFileName = vm["output"].as<std::string>();
    outputFile.open(outputFileName.c_str());
    if (outputFile.fail()) {
      std::cout << "ERROR: cannot open file " << outputFileName << " for writing " << std::endl;
      return 1;
    }
    pCout = &outputFile;
  }
  learner->learn(*pCout, "Generated with subword_learn cli");

  return 0;
}